

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerMSL::add_component_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRVariable *var,
          SPIRType *type,InterfaceBlockMeta *meta)

{
  SPIRFunction *this_00;
  bool bVar1;
  uint32_t id;
  pointer ppVar2;
  SPIREntryPoint *pSVar3;
  uint *puVar4;
  Vector<std::function<void_()>_> *pVVar5;
  bool local_189;
  anon_class_72_7_3a845519 local_180;
  function<void_()> local_138;
  anon_class_72_7_3a845519 local_108;
  function<void_()> local_c0;
  uint32_t local_9c;
  uint32_t local_98;
  uint32_t local_94;
  uint32_t local_90;
  uint32_t local_8c;
  uint32_t local_88;
  uint32_t locn;
  uint32_t num_components;
  uint32_t type_components;
  SPIRFunction *pSStack_78;
  uint32_t start_component;
  SPIRFunction *entry_func;
  _Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta>,_false>
  _Stack_68;
  bool pad_fragment_output;
  _Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta>,_false>
  local_60;
  iterator location_meta_itr;
  key_type local_4c;
  LocationMeta *pLStack_48;
  uint32_t location;
  LocationMeta *location_meta;
  InterfaceBlockMeta *meta_local;
  SPIRType *type_local;
  SPIRVariable *var_local;
  string *ib_var_ref_local;
  CompilerMSL *pCStack_18;
  StorageClass storage_local;
  CompilerMSL *this_local;
  
  pLStack_48 = (LocationMeta *)0x0;
  local_4c = 0xffffffff;
  location_meta = (LocationMeta *)meta;
  meta_local = (InterfaceBlockMeta *)type;
  type_local = (SPIRType *)var;
  var_local = (SPIRVariable *)ib_var_ref;
  ib_var_ref_local._4_4_ = storage;
  pCStack_18 = this;
  bVar1 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
  if (bVar1) {
    location_meta_itr.
    super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta>,_false>
    ._M_cur._4_4_ = (type_local->super_IVariant).self.id;
    local_4c = Compiler::get_decoration
                         ((Compiler *)this,
                          location_meta_itr.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta>,_false>
                          ._M_cur._4_4_,DecorationLocation);
    local_60._M_cur =
         (__node_type *)
         ::std::
         unordered_map<unsigned_int,_spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta>_>_>
         ::find((unordered_map<unsigned_int,_spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta>_>_>
                 *)location_meta,&local_4c);
    _Stack_68._M_cur =
         (__node_type *)
         ::std::
         end<std::unordered_map<unsigned_int,spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta>>>>
                   ((unordered_map<unsigned_int,_spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta>_>_>
                     *)location_meta);
    bVar1 = ::std::__detail::operator!=(&local_60,&stack0xffffffffffffff98);
    if (bVar1) {
      ppVar2 = ::std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta>,_false,_false>
                             *)&local_60);
      pLStack_48 = &ppVar2->second;
    }
  }
  if (pLStack_48 == (LocationMeta *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    entry_func._0_4_ = (type_local->super_IVariant).self.id;
    bVar1 = Compiler::has_decoration((Compiler *)this,entry_func._0_4_,DecorationLocation);
    local_189 = false;
    if ((bVar1) &&
       (local_189 = false, ((this->msl_options).pad_fragment_output_components & 1U) != 0)) {
      pSVar3 = Compiler::get_entry_point((Compiler *)this);
      local_189 = false;
      if (pSVar3->model == ExecutionModelFragment) {
        local_189 = ib_var_ref_local._4_4_ == Output;
      }
    }
    entry_func._7_1_ = local_189;
    id = TypedID::operator_cast_to_unsigned_int
                   ((TypedID *)&(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
    pSStack_78 = Compiler::get<spirv_cross::SPIRFunction>((Compiler *)this,id);
    num_components = (type_local->super_IVariant).self.id;
    type_components = Compiler::get_decoration((Compiler *)this,(ID)num_components,Component);
    locn = (uint32_t)(meta_local->location_meta)._M_h._M_element_count;
    local_88 = pLStack_48->num_components;
    if ((entry_func._7_1_ & 1) != 0) {
      local_90 = (type_local->super_IVariant).self.id;
      local_8c = Compiler::get_decoration((Compiler *)this,(ID)local_90,DecorationLocation);
      local_94 = get_target_components_for_fragment_location(this,local_8c);
      puVar4 = ::std::max<unsigned_int>(&local_88,&local_94);
      local_88 = *puVar4;
    }
    this_00 = pSStack_78;
    local_98 = (uint32_t)
               TypedID::operator_cast_to_TypedID((TypedID *)&(type_local->super_IVariant).self);
    SPIRFunction::add_local_variable(this_00,(VariableID)local_98);
    local_9c = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_local->super_IVariant).self)
    ;
    SmallVector<unsigned_int,_8UL>::push_back(&this->vars_needing_early_declaration,&local_9c);
    if (type_local->basetype == Void) {
      pVVar5 = &pSStack_78->fixup_hooks_in;
      local_108.type = (SPIRType *)meta_local;
      local_108.var = (SPIRVariable *)type_local;
      local_108.this = this;
      ::std::__cxx11::string::string((string *)&local_108.ib_var_ref,(string *)var_local);
      local_108.location = local_4c;
      local_108.type_components = locn;
      local_108.start_component = type_components;
      ::std::function<void()>::
      function<spirv_cross::CompilerMSL::add_component_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRVariable&,spirv_cross::SPIRType_const&,spirv_cross::CompilerMSL::InterfaceBlockMeta&)::__0,void>
                ((function<void()> *)&local_c0,&local_108);
      SmallVector<std::function<void_()>,_0UL>::push_back(pVVar5,&local_c0);
      ::std::function<void_()>::~function(&local_c0);
      add_component_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRVariable&,spirv_cross::SPIRType_const&,spirv_cross::CompilerMSL::InterfaceBlockMeta&)
      ::$_0::~__0((__0 *)&local_108);
    }
    else {
      pVVar5 = &pSStack_78->fixup_hooks_out;
      local_180.type = (SPIRType *)meta_local;
      local_180.var = (SPIRVariable *)type_local;
      local_180.this = this;
      ::std::__cxx11::string::string((string *)&local_180.ib_var_ref,(string *)var_local);
      local_180.location = local_4c;
      local_180.type_components = locn;
      local_180.start_component = type_components;
      ::std::function<void()>::
      function<spirv_cross::CompilerMSL::add_component_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRVariable&,spirv_cross::SPIRType_const&,spirv_cross::CompilerMSL::InterfaceBlockMeta&)::__1,void>
                ((function<void()> *)&local_138,&local_180);
      SmallVector<std::function<void_()>,_0UL>::push_back(pVVar5,&local_138);
      ::std::function<void_()>::~function(&local_138);
      add_component_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRVariable&,spirv_cross::SPIRType_const&,spirv_cross::CompilerMSL::InterfaceBlockMeta&)
      ::$_1::~__1((__1 *)&local_180);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerMSL::add_component_variable_to_interface_block(spv::StorageClass storage, const std::string &ib_var_ref,
                                                            SPIRVariable &var,
                                                            const SPIRType &type,
                                                            InterfaceBlockMeta &meta)
{
	// Deal with Component decorations.
	const InterfaceBlockMeta::LocationMeta *location_meta = nullptr;
	uint32_t location = ~0u;
	if (has_decoration(var.self, DecorationLocation))
	{
		location = get_decoration(var.self, DecorationLocation);
		auto location_meta_itr = meta.location_meta.find(location);
		if (location_meta_itr != end(meta.location_meta))
			location_meta = &location_meta_itr->second;
	}

	// Check if we need to pad fragment output to match a certain number of components.
	if (location_meta)
	{
		bool pad_fragment_output = has_decoration(var.self, DecorationLocation) &&
		                           msl_options.pad_fragment_output_components &&
		                           get_entry_point().model == ExecutionModelFragment && storage == StorageClassOutput;

		auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
		uint32_t start_component = get_decoration(var.self, DecorationComponent);
		uint32_t type_components = type.vecsize;
		uint32_t num_components = location_meta->num_components;

		if (pad_fragment_output)
		{
			uint32_t locn = get_decoration(var.self, DecorationLocation);
			num_components = max<uint32_t>(num_components, get_target_components_for_fragment_location(locn));
		}

		// We have already declared an IO block member as m_location_N.
		// Just emit an early-declared variable and fixup as needed.
		// Arrays need to be unrolled here since each location might need a different number of components.
		entry_func.add_local_variable(var.self);
		vars_needing_early_declaration.push_back(var.self);

		if (var.storage == StorageClassInput)
		{
			entry_func.fixup_hooks_in.push_back([=, &type, &var]() {
				if (!type.array.empty())
				{
					uint32_t array_size = to_array_size_literal(type);
					for (uint32_t loc_off = 0; loc_off < array_size; loc_off++)
					{
						statement(to_name(var.self), "[", loc_off, "]", " = ", ib_var_ref,
						          ".m_location_", location + loc_off,
						          vector_swizzle(type_components, start_component), ";");
					}
				}
				else
				{
					statement(to_name(var.self), " = ", ib_var_ref, ".m_location_", location,
					          vector_swizzle(type_components, start_component), ";");
				}
			});
		}
		else
		{
			entry_func.fixup_hooks_out.push_back([=, &type, &var]() {
				if (!type.array.empty())
				{
					uint32_t array_size = to_array_size_literal(type);
					for (uint32_t loc_off = 0; loc_off < array_size; loc_off++)
					{
						statement(ib_var_ref, ".m_location_", location + loc_off,
						          vector_swizzle(type_components, start_component), " = ",
						          to_name(var.self), "[", loc_off, "];");
					}
				}
				else
				{
					statement(ib_var_ref, ".m_location_", location,
					          vector_swizzle(type_components, start_component), " = ", to_name(var.self), ";");
				}
			});
		}
		return true;
	}
	else
		return false;
}